

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

TestBuilder * __thiscall
anon_unknown.dwarf_af3cfc::TestBuilder::PushSig
          (TestBuilder *this,CKey *key,int nHashType,uint lenR,uint lenS,SigVersion sigversion,
          CAmount amount)

{
  reference pvVar1;
  size_type sVar2;
  uint in_ECX;
  TestBuilder *in_RDI;
  uint in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  uint32_t iter;
  SigVersion in_stack_00000130;
  PrecomputedTransactionData *in_stack_00000138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> s;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uint256 hash;
  undefined4 in_stack_fffffffffffffe3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  TestBuilder *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  CMutableTransaction *in_stack_fffffffffffffe78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe88;
  undefined1 *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffeb8;
  uchar local_e9;
  uchar *local_e8;
  uchar *local_e0;
  uchar *local_d8;
  uchar *local_d0;
  uchar *local_c8;
  undefined1 local_a1;
  uchar *local_a0;
  uchar *local_98;
  iterator in_stack_ffffffffffffff70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88 [3];
  uchar local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  SignatureHash<CMutableTransaction>
            ((CScript *)in_stack_fffffffffffffe80._M_current,in_stack_fffffffffffffe78,
             (uint)((ulong)in_stack_fffffffffffffe70 >> 0x20),
             (int32_t)((ulong)in_stack_fffffffffffffea0 >> 0x20),
             (CAmount *)in_stack_fffffffffffffe68,in_stack_00000130,in_stack_00000138);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
  do {
    CKey::Sign((CKey *)in_stack_fffffffffffffeb8._M_current,(uint256 *)in_RDI,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0),(uint32_t)in_stack_fffffffffffffea0
              );
    in_stack_fffffffffffffeac = (uint)(in_R8D == 0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               (size_type)this_00);
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffe48,(size_type)this_00);
    if (in_stack_fffffffffffffeac != (*pvVar1 == '!')) {
      NegateSignatureS((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff70._M_current);
    }
    in_stack_ffffffffffffff70 =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_fffffffffffffe48,(difference_type)this_00);
    local_a0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
    local_98 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)in_stack_fffffffffffffe48,(difference_type)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               (size_type)this_00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_fffffffffffffe48,(difference_type)this_00);
    in_stack_fffffffffffffea0 = &local_a1;
    std::allocator<unsigned_char>::allocator
              ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    in_stack_fffffffffffffe68 = local_88;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
    in_stack_fffffffffffffe80._M_current = local_40;
    local_d0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
    local_c8 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)in_stack_fffffffffffffe48,(difference_type)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               (size_type)this_00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_fffffffffffffe48,(difference_type)this_00);
    local_e8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
    local_e0 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)in_stack_fffffffffffffe48,(difference_type)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               (size_type)this_00);
    local_d8 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)in_stack_fffffffffffffe48,(difference_type)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               (size_type)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               (size_type)this_00);
    in_stack_fffffffffffffeb8 =
         __gnu_cxx::
         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffffe48,(difference_type)this_00);
    in_stack_fffffffffffffe88._M_current = &local_e9;
    std::allocator<unsigned_char>::allocator
              ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48,
               this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
    in_stack_fffffffffffffe67 = true;
    if (in_ECX == sVar2) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_R9D));
      in_stack_fffffffffffffe67 = in_R8D != sVar2;
    }
  } while ((bool)in_stack_fffffffffffffe67 != false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_R9D),(value_type_conflict3 *)0xa47f0c);
  DoPush(in_stack_fffffffffffffe48,this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder& PushSig(const CKey& key, int nHashType = SIGHASH_ALL, unsigned int lenR = 32, unsigned int lenS = 32, SigVersion sigversion = SigVersion::BASE, CAmount amount = 0)
    {
        uint256 hash = SignatureHash(script, spendTx, 0, nHashType, amount, sigversion);
        std::vector<unsigned char> vchSig, r, s;
        uint32_t iter = 0;
        do {
            key.Sign(hash, vchSig, false, iter++);
            if ((lenS == 33) != (vchSig[5 + vchSig[3]] == 33)) {
                NegateSignatureS(vchSig);
            }
            r = std::vector<unsigned char>(vchSig.begin() + 4, vchSig.begin() + 4 + vchSig[3]);
            s = std::vector<unsigned char>(vchSig.begin() + 6 + vchSig[3], vchSig.begin() + 6 + vchSig[3] + vchSig[5 + vchSig[3]]);
        } while (lenR != r.size() || lenS != s.size());
        vchSig.push_back(static_cast<unsigned char>(nHashType));
        DoPush(vchSig);
        return *this;
    }